

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::LdexpCase::getInputValues(LdexpCase *this,int numValues,void **values)

{
  bool bVar1;
  deUint32 dVar2;
  DataType dataType;
  Precision PVar3;
  int iVar4;
  int min;
  int max;
  char *str;
  const_reference pvVar5;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  float min_00;
  float max_00;
  int local_fc;
  Float<unsigned_int,_8,_23,_127,_3U> local_d4;
  float out;
  int local_cc;
  float in0_2;
  int in1_2;
  deUint32 mantissa;
  int sign;
  int fpExp;
  int compNdx_2;
  int caseNdx_2;
  int numHardRandomCases;
  int in1_1;
  float in0_1;
  float in;
  int compNdx_1;
  int caseNdx_1;
  int numEasyRandomCases;
  int compNdx;
  int in1;
  float in0;
  int caseNdx;
  float easySpecialCases [8];
  int valueNdx;
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  Vec2 ranges [3];
  void **values_local;
  int numValues_local;
  LdexpCase *this_local;
  
  ranges[2].m_data = (float  [2])values;
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&rnd.m_rnd.z,-2.0,2.0);
  tcu::Vector<float,_2>::Vector(ranges,-1000.0,1000.0);
  tcu::Vector<float,_2>::Vector(ranges + 1,-1e+07,1e+07);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar2 ^ 0x2790a);
  this_00 = &(this->super_CommonFunctionCase).m_spec.inputs;
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  dataType = glu::VarType::getBasicType(&pvVar5->varType);
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  PVar3 = glu::VarType::getPrecision(&pvVar5->varType);
  iVar4 = glu::getDataTypeScalarSize(dataType);
  easySpecialCases[6] = 0.0;
  _in0 = 0x8000000000000000;
  easySpecialCases[0] = 0.5;
  easySpecialCases[1] = -0.5;
  easySpecialCases[2] = 1.0;
  easySpecialCases[3] = -1.0;
  easySpecialCases[4] = 2.0;
  easySpecialCases[5] = -2.0;
  for (in1 = 0; in1 < 8; in1 = in1 + 1) {
    frexp((double)(ulong)(uint)(&in0)[in1],&compNdx);
    for (caseNdx_1 = 0; caseNdx_1 < iVar4; caseNdx_1 = caseNdx_1 + 1) {
      *(int *)(*(long *)ranges[2].m_data + (long)((int)easySpecialCases[6] * iVar4 + caseNdx_1) * 4)
           = compNdx;
      *(int *)(*(long *)((long)ranges[2].m_data + 8) +
              (long)((int)easySpecialCases[6] * iVar4 + caseNdx_1) * 4) = numEasyRandomCases;
    }
    easySpecialCases[6] = (float)((int)easySpecialCases[6] + 1);
  }
  if (PVar3 == PRECISION_HIGHP) {
    local_fc = 0x32;
  }
  else {
    local_fc = numValues - (int)easySpecialCases[6];
  }
  compNdx_1 = local_fc;
  for (in = 0.0; (int)in < compNdx_1; in = (float)((int)in + 1)) {
    for (in0_1 = 0.0; (int)in0_1 < iVar4; in0_1 = (float)((int)in0_1 + 1)) {
      min_00 = tcu::Vector<float,_2>::x(ranges + ((ulong)PVar3 - 1));
      max_00 = tcu::Vector<float,_2>::y(ranges + ((ulong)PVar3 - 1));
      in1_1 = (int)de::Random::getFloat((Random *)&precision,min_00,max_00);
      frexp((double)(ulong)(uint)in1_1,&numHardRandomCases);
      *(int *)(*(long *)ranges[2].m_data + (long)((int)easySpecialCases[6] * iVar4 + (int)in0_1) * 4
              ) = numHardRandomCases;
      *(int *)(*(long *)((long)ranges[2].m_data + 8) +
              (long)((int)easySpecialCases[6] * iVar4 + (int)in0_1) * 4) = caseNdx_2;
    }
    easySpecialCases[6] = (float)((int)easySpecialCases[6] + 1);
  }
  compNdx_2 = numValues - (int)easySpecialCases[6];
  for (fpExp = 0; fpExp < compNdx_2; fpExp = fpExp + 1) {
    for (sign = 0; sign < iVar4; sign = sign + 1) {
      mantissa = de::Random::getInt((Random *)&precision,-0x7e,0x7f);
      bVar1 = de::Random::getBool((Random *)&precision);
      in1_2 = -(uint)bVar1 | 1;
      dVar2 = de::Random::getUint32((Random *)&precision);
      in0_2 = (float)(dVar2 & 0x7fffff | 0x800000);
      min = de::max<int>(-0x7e,-0x7e - mantissa);
      max = de::min<int>(0x7f,0x7f - mantissa);
      local_cc = de::Random::getInt((Random *)&precision,min,max);
      local_d4 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                           (in1_2,mantissa,(StorageType_conflict)in0_2);
      out = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_d4);
      ldexp((double)(ulong)(uint)out,local_cc);
      *(float *)(*(long *)ranges[2].m_data + (long)((int)easySpecialCases[6] * iVar4 + sign) * 4) =
           out;
      *(int *)(*(long *)((long)ranges[2].m_data + 8) +
              (long)((int)easySpecialCases[6] * iVar4 + sign) * 4) = local_cc;
    }
    easySpecialCases[6] = (float)((int)easySpecialCases[6] + 1);
  }
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd					(deStringHash(getName()) ^ 0x2790au);
		const glu::DataType		type				= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision			= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize			= glu::getDataTypeScalarSize(type);
		int						valueNdx			= 0;

		{
			const float easySpecialCases[] = { 0.0f, -0.0f, 0.5f, -0.5f, 1.0f, -1.0f, 2.0f, -2.0f };

			DE_ASSERT(valueNdx + DE_LENGTH_OF_ARRAY(easySpecialCases) <= numValues);
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(easySpecialCases); caseNdx++)
			{
				float	in0;
				int		in1;

				frexp(easySpecialCases[caseNdx], &in0, &in1);

				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			// \note lowp and mediump can not necessarily fit the values in hard cases, so we'll use only easy ones.
			const int numEasyRandomCases = precision == glu::PRECISION_HIGHP ? 50 : (numValues-valueNdx);

			DE_ASSERT(valueNdx + numEasyRandomCases <= numValues);
			for (int caseNdx = 0; caseNdx < numEasyRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const float	in	= rnd.getFloat(ranges[precision].x(), ranges[precision].y());
					float		in0;
					int			in1;

					frexp(in, &in0, &in1);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			const int numHardRandomCases = numValues-valueNdx;
			DE_ASSERT(numHardRandomCases >= 0 && valueNdx + numHardRandomCases <= numValues);

			for (int caseNdx = 0; caseNdx < numHardRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const int		fpExp		= rnd.getInt(-126, 127);
					const int		sign		= rnd.getBool() ? -1 : +1;
					const deUint32	mantissa	= (1u<<23) | (rnd.getUint32() & ((1u<<23)-1));
					const int		in1			= rnd.getInt(de::max(-126, -126-fpExp), de::min(127, 127-fpExp));
					const float		in0			= tcu::Float32::construct(sign, fpExp, mantissa).asFloat();

					DE_ASSERT(de::inRange(in1, -126, 127)); // See Khronos bug 11180
					DE_ASSERT(de::inRange(in1+fpExp, -126, 127));

					const float		out			= ldexp(in0, in1);

					DE_ASSERT(!tcu::Float32(out).isInf() && !tcu::Float32(out).isDenorm());
					DE_UNREF(out);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}
	}